

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

uint32_t spvtools::opt::getScalarElementCount(Type *type)

{
  Kind KVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *type_00;
  Type *type_local;
  
  KVar1 = analysis::Type::kind(type);
  if (KVar1 == kVector) {
    iVar2 = (*type->_vptr_Type[0xe])();
    type_local._4_4_ = analysis::Vector::element_count((Vector *)CONCAT44(extraout_var,iVar2));
  }
  else if (KVar1 == kMatrix) {
    iVar2 = (*type->_vptr_Type[0x10])();
    type_00 = analysis::Matrix::element_type((Matrix *)CONCAT44(extraout_var_00,iVar2));
    type_local._4_4_ = getScalarElementCount(type_00);
  }
  else {
    if (KVar1 == kStruct) {
      __assert_fail("0 && \"getScalarElementCount() does not recognized struct types\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                    ,0x94,"uint32_t spvtools::opt::getScalarElementCount(const analysis::Type &)");
    }
    type_local._4_4_ = 1;
  }
  return type_local._4_4_;
}

Assistant:

static uint32_t getScalarElementCount(const analysis::Type& type) {
  switch (type.kind()) {
    case analysis::Type::kVector:
      return type.AsVector()->element_count();
    case analysis::Type::kMatrix:
      return getScalarElementCount(*type.AsMatrix()->element_type());
    case analysis::Type::kStruct:
      assert(0 && "getScalarElementCount() does not recognized struct types");
      return 0;
    default:
      return 1;
  }
}